

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprCodeTarget(Parse *pParse,Expr *pExpr,int target)

{
  byte bVar1;
  u8 uVar2;
  Vdbe *pVVar3;
  Table *pTVar4;
  sqlite3 *psVar5;
  sqlite3 *pExpr_00;
  AggInfo *pAVar6;
  sqlite3_vtab *psVar7;
  sqlite3_module *psVar8;
  u16 uVar9;
  undefined4 uVar10;
  u8 uVar11;
  char cVar12;
  int iVar13;
  int iVar14;
  uint destIfNull;
  uint uVar15;
  FuncDef *zP4;
  char *pcVar16;
  Parse *pPVar17;
  Vdbe *pVVar18;
  VTable *pVVar19;
  byte *p;
  CollSeq *zP4_00;
  long lVar20;
  byte *pbVar21;
  Expr *pEVar22;
  ulong uVar23;
  Parse *pPVar24;
  Expr *pEVar25;
  FuncDef *pFVar26;
  Expr *pEVar27;
  FuncDef *pFVar28;
  long lVar29;
  ExprList_item *pEVar30;
  long lVar31;
  ulong uVar32;
  byte bVar33;
  int iVar34;
  int iVar35;
  int regFree1;
  undefined8 local_100;
  Parse *local_f8;
  int regFree2;
  Expr *local_e8;
  sqlite3 *local_e0;
  Vdbe *local_d8;
  int local_cc;
  Expr *local_c8;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xFunc;
  Expr *local_b0;
  Expr *local_a8;
  Expr cacheX;
  
  bVar33 = 0;
  pVVar3 = pParse->pVdbe;
  regFree1 = 0;
  regFree2 = 0;
  if (pVVar3 == (Vdbe *)0x0) {
    return 0;
  }
  if (pExpr == (Expr *)0x0) {
switchD_00178b0c_caseD_62:
    uVar15 = 10;
    iVar14 = 0;
LAB_00178b5a:
    sqlite3VdbeAddOp2(pVVar3,uVar15,iVar14,target);
    goto LAB_00179257;
  }
  bVar1 = pExpr->op;
  iVar14 = target;
  switch(bVar1) {
  case 0x13:
  case 0x5d:
    iVar14 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
    uVar15 = (uint)bVar1;
    goto LAB_00178b5a;
  case 0x14:
switchD_00178b0c_caseD_14:
    target = sqlite3CodeSubselect(pParse,pExpr,0,0);
    break;
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x51:
  case 0x5f:
  case 0x60:
  case 0x61:
    goto switchD_00178b0c_caseD_15;
  case 0x18:
  case 0x5c:
switchD_00178b0c_caseD_18:
    target = sqlite3ExprCodeTarget(pParse,pExpr->pLeft,target);
    break;
  case 0x25:
    iVar14 = sqlite3ExprCodeTarget(pParse,pExpr->pLeft,target);
    cVar12 = sqlite3AffinityType((pExpr->u).zToken);
    if (iVar14 != target) {
      sqlite3VdbeAddOp2(pVVar3,0xf,iVar14,target);
    }
    sqlite3VdbeAddOp1(pVVar3,cVar12 + 0x2c,target);
    sqlite3ExprCacheRemove(pParse,target,1);
    break;
  case 0x38:
    if (pParse->pTriggerTab == (Table *)0x0) {
      sqlite3ErrorMsg(pParse,"RAISE() may only be used within a trigger-program");
      return 0;
    }
    cVar12 = pExpr->affinity;
    if (cVar12 != '\x04') {
      if (cVar12 == '\x02') {
        pPVar17 = pParse->pToplevel;
        if (pParse->pToplevel == (Parse *)0x0) {
          pPVar17 = pParse;
        }
        pPVar17->mayAbort = '\x01';
      }
      sqlite3HaltConstraint(pParse,0x713,(int)cVar12,(pExpr->u).zToken,0);
      break;
    }
    pcVar16 = (pExpr->u).zToken;
    iVar34 = 0;
    iVar13 = 6;
    iVar35 = 0;
    iVar14 = 4;
    goto LAB_001791da;
  case 0x3c:
    pTVar4 = pExpr->pTab;
    sqlite3VdbeAddOp2(pVVar3,0x74,(int)pExpr->iColumn + (pTVar4->nCol + 1) * pExpr->iTable + 1,
                      target);
    if ((-1 < (long)pExpr->iColumn) && (pTVar4->aCol[pExpr->iColumn].affinity == 'e')) {
      sqlite3VdbeAddOp1(pVVar3,0x16,target);
    }
    break;
  case 0x44:
  case 0x45:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
    iVar13 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
    iVar14 = sqlite3ExprCodeTemp(pParse,pExpr->pRight,&regFree2);
    uVar15 = (uint)bVar1;
LAB_00178b3e:
    sqlite3VdbeAddOp3(pVVar3,uVar15,iVar14,iVar13,target);
    break;
  case 0x46:
switchD_00178b0c_caseD_46:
    iVar14 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
    iVar13 = sqlite3ExprCodeTemp(pParse,pExpr->pRight,&regFree2);
    uVar15 = (bVar1 == 0x46) + 0x4b;
    pEVar25 = pExpr->pLeft;
    pEVar22 = pExpr->pRight;
    iVar35 = 0x90;
    goto LAB_00178cf6;
  case 0x47:
    psVar5 = (sqlite3 *)pExpr->pLeft;
    local_f8 = (Parse *)((pExpr->x).pList)->a;
    pExpr_00 = local_f8->db;
    local_e0 = psVar5;
    local_d8 = pVVar3;
    iVar14 = sqlite3ExprCodeTemp(pParse,(Expr *)psVar5,&regFree1);
    local_100 = (FuncDef *)CONCAT44(local_100._4_4_,iVar14);
    iVar14 = sqlite3ExprCodeTemp(pParse,(Expr *)pExpr_00,&regFree2);
    local_e8 = (Expr *)CONCAT44(local_e8._4_4_,iVar14);
    iVar13 = sqlite3GetTempReg(pParse);
    iVar35 = sqlite3GetTempReg(pParse);
    iVar14 = (uint)local_100;
    codeCompare(pParse,(Expr *)psVar5,(Expr *)pExpr_00,0x50,(uint)local_100,(uint)local_e8,iVar13,
                0x10);
    pEVar25 = *(Expr **)&local_f8->nTempInUse;
    sqlite3ReleaseTempReg(pParse,regFree2);
    iVar34 = sqlite3ExprCodeTemp(pParse,pEVar25,&regFree2);
    codeCompare(pParse,(Expr *)local_e0,pEVar25,0x4e,iVar14,iVar34,iVar35,0x10);
    sqlite3VdbeAddOp3(local_d8,0x45,iVar13,iVar35,target);
    sqlite3ReleaseTempReg(pParse,iVar13);
    sqlite3ReleaseTempReg(pParse,iVar35);
    break;
  case 0x48:
    uVar15 = sqlite3VdbeMakeLabel(pVVar3);
    destIfNull = sqlite3VdbeMakeLabel(pVVar3);
    sqlite3VdbeAddOp2(pVVar3,10,0,target);
    sqlite3ExprCodeIN(pParse,pExpr,uVar15,destIfNull);
    sqlite3VdbeAddOp2(pVVar3,7,1,target);
    if (pVVar3->aLabel != (int *)0x0) {
      pVVar3->aLabel[(int)~uVar15] = pVVar3->nOp;
    }
    sqlite3VdbeAddOp2(pVVar3,0x14,target,0);
    if (pVVar3->aLabel != (int *)0x0) {
      pVVar3->aLabel[(int)~destIfNull] = pVVar3->nOp;
    }
    break;
  case 0x49:
  case 0x4a:
    sqlite3VdbeAddOp2(pVVar3,7,1,target);
    iVar14 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
    uVar15 = sqlite3VdbeAddOp1(pVVar3,(uint)bVar1,iVar14);
    sqlite3VdbeAddOp2(pVVar3,0x14,target,-1);
    if ((-1 < (int)uVar15) && (uVar15 < (uint)pVVar3->nOp)) {
      pVVar3->aOp[uVar15].p2 = pVVar3->nOp;
    }
    break;
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
    iVar14 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
    iVar13 = sqlite3ExprCodeTemp(pParse,pExpr->pRight,&regFree2);
    pEVar25 = pExpr->pLeft;
    pEVar22 = pExpr->pRight;
    iVar35 = 0x10;
    uVar15 = (uint)bVar1;
LAB_00178cf6:
    codeCompare(pParse,pEVar25,pEVar22,uVar15,iVar14,iVar13,target,iVar35);
    break;
  case 0x5e:
    pcVar16 = (pExpr->u).zToken;
    iVar34 = 0;
    iVar13 = 0x5e;
    iVar35 = 0;
LAB_001791da:
    sqlite3VdbeAddOp4(pVVar3,iVar13,iVar35,iVar14,0,pcVar16,iVar34);
    break;
  case 0x62:
    goto switchD_00178b0c_caseD_62;
  default:
    switch(bVar1) {
    case 0x81:
      iVar14 = 0;
      goto LAB_001792a6;
    case 0x82:
      pcVar16 = (pExpr->u).zToken;
      iVar14 = 0;
LAB_001794e3:
      codeReal(pVVar3,pcVar16,iVar14,target);
      break;
    case 0x83:
      pcVar16 = (pExpr->u).zToken;
      iVar13 = sqlite3Strlen30(pcVar16 + 2);
      pcVar16 = (char *)sqlite3HexToBlob(pVVar3->db,pcVar16 + 2,iVar13 + -1);
      iVar35 = (iVar13 + -1) / 2;
      iVar34 = -1;
      iVar13 = 0xb;
      goto LAB_001791da;
    case 0x84:
      target = pExpr->iTable;
      break;
    case 0x85:
      sqlite3VdbeAddOp2(pVVar3,0xc,(int)pExpr->iColumn,target);
      if ((pExpr->u).zToken[1] != '\0') {
        sqlite3VdbeChangeP4(pVVar3,-1,pParse->azVar[(long)pExpr->iColumn + -1],-2);
      }
      break;
    case 0x92:
      goto switchD_00178b0c_caseD_46;
    case 0x97:
    case 0x9b:
      local_e0 = pParse->db;
      local_f8 = (Parse *)local_e0->aDb->pSchema;
      uVar2 = *(u8 *)((long)&local_f8->aColCache[0].iTable + 1);
      if (((pExpr->flags & 0x4000) == 0) &&
         (local_f8 = (Parse *)(pExpr->x).pList, local_f8 != (Parse *)0x0)) {
        iVar14 = *(int *)&local_f8->db;
        local_100 = (FuncDef *)((ulong)local_100._4_4_ << 0x20);
      }
      else {
        local_100 = (FuncDef *)
                    CONCAT44(local_100._4_4_,(int)CONCAT71((int7)((ulong)local_f8 >> 8),1));
        local_f8 = (Parse *)0x0;
        iVar14 = 0;
      }
      pcVar16 = (pExpr->u).zToken;
      local_d8 = pVVar3;
      uVar15 = sqlite3Strlen30(pcVar16);
      local_e8 = (Expr *)CONCAT44(local_e8._4_4_,iVar14);
      zP4 = sqlite3FindFunction(local_e0,pcVar16,uVar15,iVar14,uVar2,'\0');
      pPVar17 = local_f8;
      if (zP4 == (FuncDef *)0x0) {
        sqlite3ErrorMsg(pParse,"unknown function: %.*s()",(ulong)uVar15,pcVar16);
        break;
      }
      if ((zP4->flags & 0x20) != 0) {
        uVar15 = sqlite3VdbeMakeLabel(local_d8);
        sqlite3ExprCode(pParse,*(Expr **)local_f8->zErrMsg,target);
        lVar31 = (long)(int)(uint)local_e8;
        lVar29 = 0x20;
        for (lVar20 = 1; lVar20 < lVar31; lVar20 = lVar20 + 1) {
          sqlite3VdbeAddOp2(local_d8,0x4a,target,uVar15);
          sqlite3ExprCacheRemove(pParse,target,1);
          pParse->iCacheLevel = pParse->iCacheLevel + 1;
          pEVar25 = *(Expr **)(local_f8->zErrMsg + lVar29);
          sqlite3ExprCode(pParse,pEVar25,target);
          sqlite3ExprCachePop(pParse,(int)pEVar25);
          lVar29 = lVar29 + 0x20;
        }
        if (local_d8->aLabel != (int *)0x0) {
          local_d8->aLabel[(int)~uVar15] = local_d8->nOp;
        }
        break;
      }
      local_cc = 0;
      uVar15 = (uint)local_e8;
      if ((char)local_100 == '\0') {
        local_cc = sqlite3GetTempRange(pParse,(uint)local_e8);
        if ((0x3f < zP4->flags) && ((**(byte **)pPVar17->zErrMsg & 0xfd) == 0x98)) {
          (*(byte **)pPVar17->zErrMsg)[0x37] = zP4->flags;
        }
        pParse->iCacheLevel = pParse->iCacheLevel + 1;
        pPVar24 = pPVar17;
        sqlite3ExprCodeExprList(pParse,(ExprList *)pPVar17,local_cc,1);
        sqlite3ExprCachePop(pParse,(int)pPVar24);
      }
      psVar5 = local_e0;
      if ((int)uVar15 < 2) {
        if (uVar15 == 1) goto LAB_00179537;
      }
      else {
        if ((pExpr->flags & 0x80) == 0) {
LAB_00179537:
          pcVar16 = pPVar17->zErrMsg;
        }
        else {
          pcVar16 = pPVar17->zErrMsg + 0x20;
        }
        pcVar16 = *(char **)pcVar16;
        xFunc = (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0;
        cacheX.op = '\0';
        cacheX.affinity = '\0';
        cacheX.flags = 0;
        cacheX._4_4_ = 0;
        if ((((pcVar16 != (char *)0x0) && (*pcVar16 == -0x68)) &&
            (pTVar4 = *(Table **)(pcVar16 + 0x40), pTVar4 != (Table *)0x0)) &&
           ((pTVar4->tabFlags & 0x10) != 0)) {
          local_100 = zP4;
          pVVar19 = sqlite3GetVTable(local_e0,pTVar4);
          psVar7 = pVVar19->pVtab;
          psVar8 = psVar7->pModule;
          zP4 = local_100;
          if ((psVar8->xFindFunction !=
               (_func_int_sqlite3_vtab_ptr_int_char_ptr_anon_subr_ptr_ptr_void_ptr_ptr *)0x0) &&
             (p = (byte *)sqlite3DbStrDup(psVar5,local_100->zName), pbVar21 = p, zP4 = local_100,
             p != (byte *)0x0)) {
            for (; (ulong)*pbVar21 != 0; pbVar21 = pbVar21 + 1) {
              *pbVar21 = ""[*pbVar21];
            }
            iVar14 = (*psVar8->xFindFunction)(psVar7,uVar15,(char *)p,&xFunc,(void **)&cacheX);
            psVar5 = local_e0;
            sqlite3DbFree(local_e0,p);
            zP4 = local_100;
            if (iVar14 != 0) {
              iVar14 = sqlite3Strlen30(local_100->zName);
              zP4 = (FuncDef *)sqlite3DbMallocZero(psVar5,iVar14 + 0x49);
              if (zP4 == (FuncDef *)0x0) {
                zP4 = local_100;
                uVar15 = (uint)local_e8;
              }
              else {
                pFVar26 = local_100;
                pFVar28 = zP4;
                for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
                  uVar2 = pFVar26->iPrefEnc;
                  uVar11 = pFVar26->flags;
                  uVar10 = *(undefined4 *)&pFVar26->field_0x4;
                  pFVar28->nArg = pFVar26->nArg;
                  pFVar28->iPrefEnc = uVar2;
                  pFVar28->flags = uVar11;
                  *(undefined4 *)&pFVar28->field_0x4 = uVar10;
                  pFVar26 = (FuncDef *)((long)pFVar26 + (ulong)bVar33 * -0x10 + 8);
                  pFVar28 = (FuncDef *)((long)pFVar28 + (ulong)bVar33 * -0x10 + 8);
                }
                zP4->zName = (char *)(zP4 + 1);
                pcVar16 = local_100->zName;
                iVar14 = sqlite3Strlen30(pcVar16);
                memcpy(zP4 + 1,pcVar16,(ulong)(iVar14 + 1));
                zP4->xFunc = xFunc;
                zP4->pUserData = (void *)cacheX._0_8_;
                zP4->flags = zP4->flags | 4;
                uVar15 = (uint)local_e8;
              }
            }
          }
        }
      }
      lVar20 = 0;
      uVar32 = 0;
      if (0 < (int)uVar15) {
        uVar32 = (ulong)uVar15;
      }
      zP4_00 = (CollSeq *)0x0;
      local_100 = (FuncDef *)((ulong)local_100 & 0xffffffff00000000);
      for (uVar23 = 0; pVVar3 = local_d8, uVar32 != uVar23; uVar23 = uVar23 + 1) {
        if ((uVar23 < 0x20) &&
           (iVar14 = sqlite3ExprIsConstant(*(Expr **)(local_f8->zErrMsg + lVar20)), iVar14 != 0)) {
          local_100 = (FuncDef *)
                      CONCAT44(local_100._4_4_,(uint)local_100 | 1 << ((uint)uVar23 & 0x1f));
        }
        if (((zP4->flags & 8) != 0) && (zP4_00 == (CollSeq *)0x0)) {
          zP4_00 = sqlite3ExprCollSeq(pParse,*(Expr **)(local_f8->zErrMsg + lVar20));
        }
        lVar20 = lVar20 + 0x20;
      }
      if ((zP4->flags & 8) != 0) {
        if (zP4_00 == (CollSeq *)0x0) {
          zP4_00 = local_e0->pDfltColl;
        }
        sqlite3VdbeAddOp4(local_d8,0x11,0,0,0,(char *)zP4_00,-4);
      }
      iVar14 = local_cc;
      sqlite3VdbeAddOp4(pVVar3,0x12,(uint)local_100,local_cc,target,(char *)zP4,-5);
      if (pVVar3->aOp != (Op *)0x0) {
        pVVar3->aOp[(long)pVVar3->nOp + -1].p5 = (u8)local_e8;
      }
      if ((uint)local_e8 != 0) {
        sqlite3ReleaseTempRange(pParse,iVar14,(uint)local_e8);
      }
      break;
    case 0x98:
      goto switchD_00178b85_caseD_98;
    case 0x99:
      if (pExpr->pAggInfo == (AggInfo *)0x0) {
        sqlite3ErrorMsg(pParse,"misuse of aggregate: %s()",(pExpr->u).zToken);
      }
      else {
        target = pExpr->pAggInfo->aFunc[pExpr->iAgg].iMem;
      }
      break;
    case 0x9a:
      pAVar6 = pExpr->pAggInfo;
      if (pAVar6->directMode == '\0') {
        target = pAVar6->aCol[pExpr->iAgg].iMem;
        break;
      }
      if (pAVar6->useSortingIdx != '\0') {
        iVar14 = pAVar6->sortingIdxPTab;
        iVar13 = pAVar6->aCol[pExpr->iAgg].iSorterColumn;
        uVar15 = 0x1d;
        goto LAB_00178b3e;
      }
      goto switchD_00178b85_caseD_98;
    case 0x9c:
      pEVar25 = pExpr->pLeft;
      if (pEVar25->op == 0x82) {
        pcVar16 = (pEVar25->u).zToken;
        iVar14 = 1;
        goto LAB_001794e3;
      }
      if (pEVar25->op != 0x81) {
        iVar13 = sqlite3GetTempReg(pParse);
        regFree1 = iVar13;
        sqlite3VdbeAddOp2(pVVar3,7,0,iVar13);
        iVar14 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree2);
        uVar15 = 0x57;
        goto LAB_00178b3e;
      }
      iVar14 = 1;
      pExpr = pEVar25;
LAB_001792a6:
      codeInteger(pParse,pExpr,iVar14,target);
      break;
    case 0x9d:
      goto switchD_00178b0c_caseD_18;
    default:
      if (bVar1 == 0x74) goto switchD_00178b0c_caseD_14;
    case 0x86:
    case 0x87:
    case 0x88:
    case 0x89:
    case 0x8a:
    case 0x8b:
    case 0x8c:
    case 0x8d:
    case 0x8e:
    case 0x8f:
    case 0x90:
    case 0x91:
    case 0x93:
    case 0x94:
    case 0x95:
    case 0x96:
switchD_00178b0c_caseD_15:
      pEVar30 = ((pExpr->x).pList)->a;
      local_100 = (FuncDef *)(long)((pExpr->x).pList)->nExpr;
      local_f8 = pParse;
      iVar14 = sqlite3VdbeMakeLabel(pVVar3);
      local_e0 = (sqlite3 *)CONCAT44(local_e0._4_4_,iVar14);
      pEVar25 = pExpr->pLeft;
      if (pEVar25 == (Expr *)0x0) {
        pEVar22 = (Expr *)0x0;
      }
      else {
        local_b0 = &cacheX;
        pEVar22 = pEVar25;
        pEVar27 = local_b0;
        for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
          cVar12 = pEVar22->affinity;
          uVar9 = pEVar22->flags;
          uVar10 = *(undefined4 *)&pEVar22->field_0x4;
          pEVar27->op = pEVar22->op;
          pEVar27->affinity = cVar12;
          pEVar27->flags = uVar9;
          *(undefined4 *)&pEVar27->field_0x4 = uVar10;
          pEVar22 = (Expr *)((long)pEVar22 + (ulong)bVar33 * -0x10 + 8);
          pEVar27 = (Expr *)((long)pEVar27 + (ulong)bVar33 * -0x10 + 8);
        }
        cacheX.iTable = sqlite3ExprCodeTemp(local_f8,pEVar25,&regFree1);
        cacheX.op = 0x84;
        pEVar22 = (Expr *)&xFunc;
        xFunc = (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)
                CONCAT71(xFunc._1_7_,0x4c);
        regFree1 = 0;
      }
      pEVar30 = pEVar30 + 1;
      pVVar18 = (Vdbe *)0x0;
      local_e8 = pEVar25;
      local_c8 = pExpr;
      while (pPVar17 = local_f8, (long)pVVar18 < (long)local_100) {
        local_f8->iCacheLevel = local_f8->iCacheLevel + 1;
        pEVar25 = pEVar30[-1].pExpr;
        if (local_e8 != (Expr *)0x0) {
          pEVar25 = pEVar22;
          local_a8 = pEVar30[-1].pExpr;
        }
        pEVar22 = pEVar25;
        local_d8 = pVVar18;
        uVar15 = sqlite3VdbeMakeLabel(pVVar3);
        pPVar17 = local_f8;
        sqlite3ExprIfFalse(local_f8,pEVar22,uVar15,8);
        sqlite3ExprCode(pPVar17,pEVar30->pExpr,target);
        iVar14 = 1;
        sqlite3VdbeAddOp2(pVVar3,1,0,(uint)local_e0);
        sqlite3ExprCachePop(pPVar17,iVar14);
        if (pVVar3->aLabel != (int *)0x0) {
          pVVar3->aLabel[(int)~uVar15] = pVVar3->nOp;
        }
        pEVar30 = pEVar30 + 2;
        pVVar18 = (Vdbe *)((long)&local_d8->db + 2);
      }
      pEVar25 = local_c8->pRight;
      if (pEVar25 == (Expr *)0x0) {
        sqlite3VdbeAddOp2(pVVar3,10,0,target);
      }
      else {
        local_f8->iCacheLevel = local_f8->iCacheLevel + 1;
        sqlite3ExprCode(local_f8,pEVar25,target);
        sqlite3ExprCachePop(pPVar17,(int)pEVar25);
      }
      pParse = local_f8;
      if (pVVar3->aLabel != (int *)0x0) {
        pVVar3->aLabel[(int)~(uint)local_e0] = pVVar3->nOp;
      }
    }
  }
LAB_00179257:
  sqlite3ReleaseTempReg(pParse,regFree1);
  sqlite3ReleaseTempReg(pParse,regFree2);
  return target;
switchD_00178b85_caseD_98:
  if (pExpr->iTable < 0) {
    target = (int)pExpr->iColumn + pParse->ckBase;
  }
  else {
    target = sqlite3ExprCodeGetColumn
                       (pParse,pExpr->pTab,(int)pExpr->iColumn,pExpr->iTable,target,pExpr->op2);
  }
  goto LAB_00179257;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeTarget(Parse *pParse, Expr *pExpr, int target){
  Vdbe *v = pParse->pVdbe;  /* The VM under construction */
  int op;                   /* The opcode being coded */
  int inReg = target;       /* Results stored in register inReg */
  int regFree1 = 0;         /* If non-zero free this temporary register */
  int regFree2 = 0;         /* If non-zero free this temporary register */
  int r1, r2, r3, r4;       /* Various register numbers */
  sqlite3 *db = pParse->db; /* The database connection */

  assert( target>0 && target<=pParse->nMem );
  if( v==0 ){
    assert( pParse->db->mallocFailed );
    return 0;
  }

  if( pExpr==0 ){
    op = TK_NULL;
  }else{
    op = pExpr->op;
  }
  switch( op ){
    case TK_AGG_COLUMN: {
      AggInfo *pAggInfo = pExpr->pAggInfo;
      struct AggInfo_col *pCol = &pAggInfo->aCol[pExpr->iAgg];
      if( !pAggInfo->directMode ){
        assert( pCol->iMem>0 );
        inReg = pCol->iMem;
        break;
      }else if( pAggInfo->useSortingIdx ){
        sqlite3VdbeAddOp3(v, OP_Column, pAggInfo->sortingIdxPTab,
                              pCol->iSorterColumn, target);
        break;
      }
      /* Otherwise, fall thru into the TK_COLUMN case */
    }
    case TK_COLUMN: {
      if( pExpr->iTable<0 ){
        /* This only happens when coding check constraints */
        assert( pParse->ckBase>0 );
        inReg = pExpr->iColumn + pParse->ckBase;
      }else{
        inReg = sqlite3ExprCodeGetColumn(pParse, pExpr->pTab,
                                 pExpr->iColumn, pExpr->iTable, target,
                                 pExpr->op2);
      }
      break;
    }
    case TK_INTEGER: {
      codeInteger(pParse, pExpr, 0, target);
      break;
    }
#ifndef SQLITE_OMIT_FLOATING_POINT
    case TK_FLOAT: {
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      codeReal(v, pExpr->u.zToken, 0, target);
      break;
    }
#endif
    case TK_STRING: {
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      sqlite3VdbeAddOp4(v, OP_String8, 0, target, 0, pExpr->u.zToken, 0);
      break;
    }
    case TK_NULL: {
      sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      break;
    }
#ifndef SQLITE_OMIT_BLOB_LITERAL
    case TK_BLOB: {
      int n;
      const char *z;
      char *zBlob;
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      assert( pExpr->u.zToken[0]=='x' || pExpr->u.zToken[0]=='X' );
      assert( pExpr->u.zToken[1]=='\'' );
      z = &pExpr->u.zToken[2];
      n = sqlite3Strlen30(z) - 1;
      assert( z[n]=='\'' );
      zBlob = sqlite3HexToBlob(sqlite3VdbeDb(v), z, n);
      sqlite3VdbeAddOp4(v, OP_Blob, n/2, target, 0, zBlob, P4_DYNAMIC);
      break;
    }
#endif
    case TK_VARIABLE: {
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      assert( pExpr->u.zToken!=0 );
      assert( pExpr->u.zToken[0]!=0 );
      sqlite3VdbeAddOp2(v, OP_Variable, pExpr->iColumn, target);
      if( pExpr->u.zToken[1]!=0 ){
        assert( pExpr->u.zToken[0]=='?' 
             || strcmp(pExpr->u.zToken, pParse->azVar[pExpr->iColumn-1])==0 );
        sqlite3VdbeChangeP4(v, -1, pParse->azVar[pExpr->iColumn-1], P4_STATIC);
      }
      break;
    }
    case TK_REGISTER: {
      inReg = pExpr->iTable;
      break;
    }
    case TK_AS: {
      inReg = sqlite3ExprCodeTarget(pParse, pExpr->pLeft, target);
      break;
    }
#ifndef SQLITE_OMIT_CAST
    case TK_CAST: {
      /* Expressions of the form:   CAST(pLeft AS token) */
      int aff, to_op;
      inReg = sqlite3ExprCodeTarget(pParse, pExpr->pLeft, target);
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      aff = sqlite3AffinityType(pExpr->u.zToken);
      to_op = aff - SQLITE_AFF_TEXT + OP_ToText;
      assert( to_op==OP_ToText    || aff!=SQLITE_AFF_TEXT    );
      assert( to_op==OP_ToBlob    || aff!=SQLITE_AFF_NONE    );
      assert( to_op==OP_ToNumeric || aff!=SQLITE_AFF_NUMERIC );
      assert( to_op==OP_ToInt     || aff!=SQLITE_AFF_INTEGER );
      assert( to_op==OP_ToReal    || aff!=SQLITE_AFF_REAL    );
      testcase( to_op==OP_ToText );
      testcase( to_op==OP_ToBlob );
      testcase( to_op==OP_ToNumeric );
      testcase( to_op==OP_ToInt );
      testcase( to_op==OP_ToReal );
      if( inReg!=target ){
        sqlite3VdbeAddOp2(v, OP_SCopy, inReg, target);
        inReg = target;
      }
      sqlite3VdbeAddOp1(v, to_op, inReg);
      testcase( usedAsColumnCache(pParse, inReg, inReg) );
      sqlite3ExprCacheAffinityChange(pParse, inReg, 1);
      break;
    }
#endif /* SQLITE_OMIT_CAST */
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE:
    case TK_NE:
    case TK_EQ: {
      assert( TK_LT==OP_Lt );
      assert( TK_LE==OP_Le );
      assert( TK_GT==OP_Gt );
      assert( TK_GE==OP_Ge );
      assert( TK_EQ==OP_Eq );
      assert( TK_NE==OP_Ne );
      testcase( op==TK_LT );
      testcase( op==TK_LE );
      testcase( op==TK_GT );
      testcase( op==TK_GE );
      testcase( op==TK_EQ );
      testcase( op==TK_NE );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      codeCompare(pParse, pExpr->pLeft, pExpr->pRight, op,
                  r1, r2, inReg, SQLITE_STOREP2);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_IS:
    case TK_ISNOT: {
      testcase( op==TK_IS );
      testcase( op==TK_ISNOT );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      op = (op==TK_IS) ? TK_EQ : TK_NE;
      codeCompare(pParse, pExpr->pLeft, pExpr->pRight, op,
                  r1, r2, inReg, SQLITE_STOREP2 | SQLITE_NULLEQ);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_AND:
    case TK_OR:
    case TK_PLUS:
    case TK_STAR:
    case TK_MINUS:
    case TK_REM:
    case TK_BITAND:
    case TK_BITOR:
    case TK_SLASH:
    case TK_LSHIFT:
    case TK_RSHIFT: 
    case TK_CONCAT: {
      assert( TK_AND==OP_And );
      assert( TK_OR==OP_Or );
      assert( TK_PLUS==OP_Add );
      assert( TK_MINUS==OP_Subtract );
      assert( TK_REM==OP_Remainder );
      assert( TK_BITAND==OP_BitAnd );
      assert( TK_BITOR==OP_BitOr );
      assert( TK_SLASH==OP_Divide );
      assert( TK_LSHIFT==OP_ShiftLeft );
      assert( TK_RSHIFT==OP_ShiftRight );
      assert( TK_CONCAT==OP_Concat );
      testcase( op==TK_AND );
      testcase( op==TK_OR );
      testcase( op==TK_PLUS );
      testcase( op==TK_MINUS );
      testcase( op==TK_REM );
      testcase( op==TK_BITAND );
      testcase( op==TK_BITOR );
      testcase( op==TK_SLASH );
      testcase( op==TK_LSHIFT );
      testcase( op==TK_RSHIFT );
      testcase( op==TK_CONCAT );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      sqlite3VdbeAddOp3(v, op, r2, r1, target);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_UMINUS: {
      Expr *pLeft = pExpr->pLeft;
      assert( pLeft );
      if( pLeft->op==TK_INTEGER ){
        codeInteger(pParse, pLeft, 1, target);
#ifndef SQLITE_OMIT_FLOATING_POINT
      }else if( pLeft->op==TK_FLOAT ){
        assert( !ExprHasProperty(pExpr, EP_IntValue) );
        codeReal(v, pLeft->u.zToken, 1, target);
#endif
      }else{
        regFree1 = r1 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v, OP_Integer, 0, r1);
        r2 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree2);
        sqlite3VdbeAddOp3(v, OP_Subtract, r2, r1, target);
        testcase( regFree2==0 );
      }
      inReg = target;
      break;
    }
    case TK_BITNOT:
    case TK_NOT: {
      assert( TK_BITNOT==OP_BitNot );
      assert( TK_NOT==OP_Not );
      testcase( op==TK_BITNOT );
      testcase( op==TK_NOT );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      testcase( regFree1==0 );
      inReg = target;
      sqlite3VdbeAddOp2(v, op, r1, inReg);
      break;
    }
    case TK_ISNULL:
    case TK_NOTNULL: {
      int addr;
      assert( TK_ISNULL==OP_IsNull );
      assert( TK_NOTNULL==OP_NotNull );
      testcase( op==TK_ISNULL );
      testcase( op==TK_NOTNULL );
      sqlite3VdbeAddOp2(v, OP_Integer, 1, target);
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      testcase( regFree1==0 );
      addr = sqlite3VdbeAddOp1(v, op, r1);
      sqlite3VdbeAddOp2(v, OP_AddImm, target, -1);
      sqlite3VdbeJumpHere(v, addr);
      break;
    }
    case TK_AGG_FUNCTION: {
      AggInfo *pInfo = pExpr->pAggInfo;
      if( pInfo==0 ){
        assert( !ExprHasProperty(pExpr, EP_IntValue) );
        sqlite3ErrorMsg(pParse, "misuse of aggregate: %s()", pExpr->u.zToken);
      }else{
        inReg = pInfo->aFunc[pExpr->iAgg].iMem;
      }
      break;
    }
    case TK_CONST_FUNC:
    case TK_FUNCTION: {
      ExprList *pFarg;       /* List of function arguments */
      int nFarg;             /* Number of function arguments */
      FuncDef *pDef;         /* The function definition object */
      int nId;               /* Length of the function name in bytes */
      const char *zId;       /* The function name */
      int constMask = 0;     /* Mask of function arguments that are constant */
      int i;                 /* Loop counter */
      u8 enc = ENC(db);      /* The text encoding used by this database */
      CollSeq *pColl = 0;    /* A collating sequence */

      assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
      testcase( op==TK_CONST_FUNC );
      testcase( op==TK_FUNCTION );
      if( ExprHasAnyProperty(pExpr, EP_TokenOnly) ){
        pFarg = 0;
      }else{
        pFarg = pExpr->x.pList;
      }
      nFarg = pFarg ? pFarg->nExpr : 0;
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      zId = pExpr->u.zToken;
      nId = sqlite3Strlen30(zId);
      pDef = sqlite3FindFunction(db, zId, nId, nFarg, enc, 0);
      if( pDef==0 ){
        sqlite3ErrorMsg(pParse, "unknown function: %.*s()", nId, zId);
        break;
      }

      /* Attempt a direct implementation of the built-in COALESCE() and
      ** IFNULL() functions.  This avoids unnecessary evalation of
      ** arguments past the first non-NULL argument.
      */
      if( pDef->flags & SQLITE_FUNC_COALESCE ){
        int endCoalesce = sqlite3VdbeMakeLabel(v);
        assert( nFarg>=2 );
        sqlite3ExprCode(pParse, pFarg->a[0].pExpr, target);
        for(i=1; i<nFarg; i++){
          sqlite3VdbeAddOp2(v, OP_NotNull, target, endCoalesce);
          sqlite3ExprCacheRemove(pParse, target, 1);
          sqlite3ExprCachePush(pParse);
          sqlite3ExprCode(pParse, pFarg->a[i].pExpr, target);
          sqlite3ExprCachePop(pParse, 1);
        }
        sqlite3VdbeResolveLabel(v, endCoalesce);
        break;
      }


      if( pFarg ){
        r1 = sqlite3GetTempRange(pParse, nFarg);

        /* For length() and typeof() functions with a column argument,
        ** set the P5 parameter to the OP_Column opcode to OPFLAG_LENGTHARG
        ** or OPFLAG_TYPEOFARG respectively, to avoid unnecessary data
        ** loading.
        */
        if( (pDef->flags & (SQLITE_FUNC_LENGTH|SQLITE_FUNC_TYPEOF))!=0 ){
          u8 exprOp;
          assert( nFarg==1 );
          assert( pFarg->a[0].pExpr!=0 );
          exprOp = pFarg->a[0].pExpr->op;
          if( exprOp==TK_COLUMN || exprOp==TK_AGG_COLUMN ){
            assert( SQLITE_FUNC_LENGTH==OPFLAG_LENGTHARG );
            assert( SQLITE_FUNC_TYPEOF==OPFLAG_TYPEOFARG );
            testcase( pDef->flags==SQLITE_FUNC_LENGTH );
            pFarg->a[0].pExpr->op2 = pDef->flags;
          }
        }

        sqlite3ExprCachePush(pParse);     /* Ticket 2ea2425d34be */
        sqlite3ExprCodeExprList(pParse, pFarg, r1, 1);
        sqlite3ExprCachePop(pParse, 1);   /* Ticket 2ea2425d34be */
      }else{
        r1 = 0;
      }
#ifndef SQLITE_OMIT_VIRTUALTABLE
      /* Possibly overload the function if the first argument is
      ** a virtual table column.
      **
      ** For infix functions (LIKE, GLOB, REGEXP, and MATCH) use the
      ** second argument, not the first, as the argument to test to
      ** see if it is a column in a virtual table.  This is done because
      ** the left operand of infix functions (the operand we want to
      ** control overloading) ends up as the second argument to the
      ** function.  The expression "A glob B" is equivalent to 
      ** "glob(B,A).  We want to use the A in "A glob B" to test
      ** for function overloading.  But we use the B term in "glob(B,A)".
      */
      if( nFarg>=2 && (pExpr->flags & EP_InfixFunc) ){
        pDef = sqlite3VtabOverloadFunction(db, pDef, nFarg, pFarg->a[1].pExpr);
      }else if( nFarg>0 ){
        pDef = sqlite3VtabOverloadFunction(db, pDef, nFarg, pFarg->a[0].pExpr);
      }
#endif
      for(i=0; i<nFarg; i++){
        if( i<32 && sqlite3ExprIsConstant(pFarg->a[i].pExpr) ){
          constMask |= (1<<i);
        }
        if( (pDef->flags & SQLITE_FUNC_NEEDCOLL)!=0 && !pColl ){
          pColl = sqlite3ExprCollSeq(pParse, pFarg->a[i].pExpr);
        }
      }
      if( pDef->flags & SQLITE_FUNC_NEEDCOLL ){
        if( !pColl ) pColl = db->pDfltColl; 
        sqlite3VdbeAddOp4(v, OP_CollSeq, 0, 0, 0, (char *)pColl, P4_COLLSEQ);
      }
      sqlite3VdbeAddOp4(v, OP_Function, constMask, r1, target,
                        (char*)pDef, P4_FUNCDEF);
      sqlite3VdbeChangeP5(v, (u8)nFarg);
      if( nFarg ){
        sqlite3ReleaseTempRange(pParse, r1, nFarg);
      }
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_EXISTS:
    case TK_SELECT: {
      testcase( op==TK_EXISTS );
      testcase( op==TK_SELECT );
      inReg = sqlite3CodeSubselect(pParse, pExpr, 0, 0);
      break;
    }
    case TK_IN: {
      int destIfFalse = sqlite3VdbeMakeLabel(v);
      int destIfNull = sqlite3VdbeMakeLabel(v);
      sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      sqlite3ExprCodeIN(pParse, pExpr, destIfFalse, destIfNull);
      sqlite3VdbeAddOp2(v, OP_Integer, 1, target);
      sqlite3VdbeResolveLabel(v, destIfFalse);
      sqlite3VdbeAddOp2(v, OP_AddImm, target, 0);
      sqlite3VdbeResolveLabel(v, destIfNull);
      break;
    }
#endif /* SQLITE_OMIT_SUBQUERY */


    /*
    **    x BETWEEN y AND z
    **
    ** This is equivalent to
    **
    **    x>=y AND x<=z
    **
    ** X is stored in pExpr->pLeft.
    ** Y is stored in pExpr->pList->a[0].pExpr.
    ** Z is stored in pExpr->pList->a[1].pExpr.
    */
    case TK_BETWEEN: {
      Expr *pLeft = pExpr->pLeft;
      struct ExprList_item *pLItem = pExpr->x.pList->a;
      Expr *pRight = pLItem->pExpr;

      r1 = sqlite3ExprCodeTemp(pParse, pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pRight, &regFree2);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      r3 = sqlite3GetTempReg(pParse);
      r4 = sqlite3GetTempReg(pParse);
      codeCompare(pParse, pLeft, pRight, OP_Ge,
                  r1, r2, r3, SQLITE_STOREP2);
      pLItem++;
      pRight = pLItem->pExpr;
      sqlite3ReleaseTempReg(pParse, regFree2);
      r2 = sqlite3ExprCodeTemp(pParse, pRight, &regFree2);
      testcase( regFree2==0 );
      codeCompare(pParse, pLeft, pRight, OP_Le, r1, r2, r4, SQLITE_STOREP2);
      sqlite3VdbeAddOp3(v, OP_And, r3, r4, target);
      sqlite3ReleaseTempReg(pParse, r3);
      sqlite3ReleaseTempReg(pParse, r4);
      break;
    }
    case TK_COLLATE: 
    case TK_UPLUS: {
      inReg = sqlite3ExprCodeTarget(pParse, pExpr->pLeft, target);
      break;
    }

    case TK_TRIGGER: {
      /* If the opcode is TK_TRIGGER, then the expression is a reference
      ** to a column in the new.* or old.* pseudo-tables available to
      ** trigger programs. In this case Expr.iTable is set to 1 for the
      ** new.* pseudo-table, or 0 for the old.* pseudo-table. Expr.iColumn
      ** is set to the column of the pseudo-table to read, or to -1 to
      ** read the rowid field.
      **
      ** The expression is implemented using an OP_Param opcode. The p1
      ** parameter is set to 0 for an old.rowid reference, or to (i+1)
      ** to reference another column of the old.* pseudo-table, where 
      ** i is the index of the column. For a new.rowid reference, p1 is
      ** set to (n+1), where n is the number of columns in each pseudo-table.
      ** For a reference to any other column in the new.* pseudo-table, p1
      ** is set to (n+2+i), where n and i are as defined previously. For
      ** example, if the table on which triggers are being fired is
      ** declared as:
      **
      **   CREATE TABLE t1(a, b);
      **
      ** Then p1 is interpreted as follows:
      **
      **   p1==0   ->    old.rowid     p1==3   ->    new.rowid
      **   p1==1   ->    old.a         p1==4   ->    new.a
      **   p1==2   ->    old.b         p1==5   ->    new.b       
      */
      Table *pTab = pExpr->pTab;
      int p1 = pExpr->iTable * (pTab->nCol+1) + 1 + pExpr->iColumn;

      assert( pExpr->iTable==0 || pExpr->iTable==1 );
      assert( pExpr->iColumn>=-1 && pExpr->iColumn<pTab->nCol );
      assert( pTab->iPKey<0 || pExpr->iColumn!=pTab->iPKey );
      assert( p1>=0 && p1<(pTab->nCol*2+2) );

      sqlite3VdbeAddOp2(v, OP_Param, p1, target);
      VdbeComment((v, "%s.%s -> $%d",
        (pExpr->iTable ? "new" : "old"),
        (pExpr->iColumn<0 ? "rowid" : pExpr->pTab->aCol[pExpr->iColumn].zName),
        target
      ));

#ifndef SQLITE_OMIT_FLOATING_POINT
      /* If the column has REAL affinity, it may currently be stored as an
      ** integer. Use OP_RealAffinity to make sure it is really real.  */
      if( pExpr->iColumn>=0 
       && pTab->aCol[pExpr->iColumn].affinity==SQLITE_AFF_REAL
      ){
        sqlite3VdbeAddOp1(v, OP_RealAffinity, target);
      }
#endif
      break;
    }


    /*
    ** Form A:
    **   CASE x WHEN e1 THEN r1 WHEN e2 THEN r2 ... WHEN eN THEN rN ELSE y END
    **
    ** Form B:
    **   CASE WHEN e1 THEN r1 WHEN e2 THEN r2 ... WHEN eN THEN rN ELSE y END
    **
    ** Form A is can be transformed into the equivalent form B as follows:
    **   CASE WHEN x=e1 THEN r1 WHEN x=e2 THEN r2 ...
    **        WHEN x=eN THEN rN ELSE y END
    **
    ** X (if it exists) is in pExpr->pLeft.
    ** Y is in pExpr->pRight.  The Y is also optional.  If there is no
    ** ELSE clause and no other term matches, then the result of the
    ** exprssion is NULL.
    ** Ei is in pExpr->pList->a[i*2] and Ri is pExpr->pList->a[i*2+1].
    **
    ** The result of the expression is the Ri for the first matching Ei,
    ** or if there is no matching Ei, the ELSE term Y, or if there is
    ** no ELSE term, NULL.
    */
    default: assert( op==TK_CASE ); {
      int endLabel;                     /* GOTO label for end of CASE stmt */
      int nextCase;                     /* GOTO label for next WHEN clause */
      int nExpr;                        /* 2x number of WHEN terms */
      int i;                            /* Loop counter */
      ExprList *pEList;                 /* List of WHEN terms */
      struct ExprList_item *aListelem;  /* Array of WHEN terms */
      Expr opCompare;                   /* The X==Ei expression */
      Expr cacheX;                      /* Cached expression X */
      Expr *pX;                         /* The X expression */
      Expr *pTest = 0;                  /* X==Ei (form A) or just Ei (form B) */
      VVA_ONLY( int iCacheLevel = pParse->iCacheLevel; )

      assert( !ExprHasProperty(pExpr, EP_xIsSelect) && pExpr->x.pList );
      assert((pExpr->x.pList->nExpr % 2) == 0);
      assert(pExpr->x.pList->nExpr > 0);
      pEList = pExpr->x.pList;
      aListelem = pEList->a;
      nExpr = pEList->nExpr;
      endLabel = sqlite3VdbeMakeLabel(v);
      if( (pX = pExpr->pLeft)!=0 ){
        cacheX = *pX;
        testcase( pX->op==TK_COLUMN );
        testcase( pX->op==TK_REGISTER );
        cacheX.iTable = sqlite3ExprCodeTemp(pParse, pX, &regFree1);
        testcase( regFree1==0 );
        cacheX.op = TK_REGISTER;
        opCompare.op = TK_EQ;
        opCompare.pLeft = &cacheX;
        pTest = &opCompare;
        /* Ticket b351d95f9cd5ef17e9d9dbae18f5ca8611190001:
        ** The value in regFree1 might get SCopy-ed into the file result.
        ** So make sure that the regFree1 register is not reused for other
        ** purposes and possibly overwritten.  */
        regFree1 = 0;
      }
      for(i=0; i<nExpr; i=i+2){
        sqlite3ExprCachePush(pParse);
        if( pX ){
          assert( pTest!=0 );
          opCompare.pRight = aListelem[i].pExpr;
        }else{
          pTest = aListelem[i].pExpr;
        }
        nextCase = sqlite3VdbeMakeLabel(v);
        testcase( pTest->op==TK_COLUMN );
        sqlite3ExprIfFalse(pParse, pTest, nextCase, SQLITE_JUMPIFNULL);
        testcase( aListelem[i+1].pExpr->op==TK_COLUMN );
        testcase( aListelem[i+1].pExpr->op==TK_REGISTER );
        sqlite3ExprCode(pParse, aListelem[i+1].pExpr, target);
        sqlite3VdbeAddOp2(v, OP_Goto, 0, endLabel);
        sqlite3ExprCachePop(pParse, 1);
        sqlite3VdbeResolveLabel(v, nextCase);
      }
      if( pExpr->pRight ){
        sqlite3ExprCachePush(pParse);
        sqlite3ExprCode(pParse, pExpr->pRight, target);
        sqlite3ExprCachePop(pParse, 1);
      }else{
        sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      }
      assert( db->mallocFailed || pParse->nErr>0 
           || pParse->iCacheLevel==iCacheLevel );
      sqlite3VdbeResolveLabel(v, endLabel);
      break;
    }
#ifndef SQLITE_OMIT_TRIGGER
    case TK_RAISE: {
      assert( pExpr->affinity==OE_Rollback 
           || pExpr->affinity==OE_Abort
           || pExpr->affinity==OE_Fail
           || pExpr->affinity==OE_Ignore
      );
      if( !pParse->pTriggerTab ){
        sqlite3ErrorMsg(pParse,
                       "RAISE() may only be used within a trigger-program");
        return 0;
      }
      if( pExpr->affinity==OE_Abort ){
        sqlite3MayAbort(pParse);
      }
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      if( pExpr->affinity==OE_Ignore ){
        sqlite3VdbeAddOp4(
            v, OP_Halt, SQLITE_OK, OE_Ignore, 0, pExpr->u.zToken,0);
      }else{
        sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_TRIGGER,
                              pExpr->affinity, pExpr->u.zToken, 0);
      }

      break;
    }
#endif
  }
  sqlite3ReleaseTempReg(pParse, regFree1);
  sqlite3ReleaseTempReg(pParse, regFree2);
  return inReg;
}